

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

path * boost::filesystem::detail::system_complete
                 (path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  path *ppVar4;
  path local_60;
  path local_40;
  
  if (((p->m_pathname)._M_string_length == 0) || (bVar3 = path::has_root_directory(p), bVar3)) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    pcVar2 = (p->m_pathname)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (p->m_pathname)._M_string_length);
    return __return_storage_ptr__;
  }
  current_path(&local_40,(error_code *)0x0);
  paVar1 = &local_60.m_pathname.field_2;
  local_60.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_40.m_pathname._M_dataplus._M_p,
             local_40.m_pathname._M_dataplus._M_p + local_40.m_pathname._M_string_length);
  ppVar4 = path::operator/=(&local_60,p);
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  pcVar2 = (ppVar4->m_pathname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (ppVar4->m_pathname)._M_string_length)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.m_pathname._M_dataplus._M_p,
                    local_60.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_pathname._M_dataplus._M_p == &local_40.m_pathname.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_40.m_pathname._M_dataplus._M_p,
                  local_40.m_pathname.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path system_complete(const path& p, system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API
    return (p.empty() || p.is_absolute())
      ? p : current_path()/ p;

#   else
    if (p.empty())
    {
      if (ec != 0) ec->clear();
      return p;
    }
    wchar_t buf[buf_size];
    wchar_t* pfn;
    std::size_t len = get_full_path_name(p, buf_size, buf, &pfn);

    if (error(len == 0 ? BOOST_ERRNO : 0, p, ec, "boost::filesystem::system_complete"))
      return path();

    if (len < buf_size)// len does not include null termination character
      return path(&buf[0]);

    boost::scoped_array<wchar_t> big_buf(new wchar_t[len]);

    return error(get_full_path_name(p, len , big_buf.get(), &pfn)== 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::system_complete")
      ? path()
      : path(big_buf.get());
#   endif
  }